

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O1

void vgatherps_(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  UInt8 UVar2;
  Int32 IVar3;
  bool bVar4;
  
  if ((pMyDisasm->Prefix).OperandSize != '\x01') {
LAB_00132c70:
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
    (pMyDisasm->Operand1).AccessMode = 0;
    (pMyDisasm->Operand2).AccessMode = 0;
    (pMyDisasm->Operand3).AccessMode = 0;
    (pMyDisasm->Operand4).AccessMode = 0;
    (pMyDisasm->Operand5).AccessMode = 0;
    (pMyDisasm->Operand6).AccessMode = 0;
    (pMyDisasm->Operand7).AccessMode = 0;
    (pMyDisasm->Operand8).AccessMode = 0;
    (pMyDisasm->Operand9).AccessMode = 0;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
    return;
  }
  (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
  (pMyDisasm->Prefix).OperandSize = '\b';
  if ((pMyDisasm->Reserved_).VEX.state != '\x01') goto LAB_00132c70;
  if ((((pMyDisasm->Reserved_).REX.W_ == '\0') && ((pMyDisasm->Reserved_).EVEX.state != '\x01')) ||
     ((UVar1 = (pMyDisasm->Reserved_).EVEX.state, UVar1 == '\x01' &&
      ((pMyDisasm->Reserved_).EVEX.W == '\0')))) {
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vgatherdps",0xb);
    (pMyDisasm->Reserved_).EVEX.masking = '\x01';
    UVar1 = (pMyDisasm->Reserved_).VEX.L;
    if (UVar1 == '\x01') {
      UVar1 = (pMyDisasm->Reserved_).EVEX.state;
      (pMyDisasm->Instruction).Category = (uint)(UVar1 == '\x01') * 0x20000 + 0x120000;
      (pMyDisasm->Reserved_).VSIB_ = 8;
      (pMyDisasm->Reserved_).Register_ = 4;
      (pMyDisasm->Reserved_).MemDecoration = 0x67;
      bVar4 = UVar1 == '\x01';
    }
    else {
      if (UVar1 != '\0') {
        if ((pMyDisasm->Reserved_).EVEX.LL != '\x02') {
          return;
        }
        (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
        (pMyDisasm->Instruction).Category = 0x140000;
        (pMyDisasm->Reserved_).VSIB_ = 0x10;
        (pMyDisasm->Reserved_).Register_ = 8;
        (pMyDisasm->Reserved_).MemDecoration = 0x67;
        goto LAB_00132e58;
      }
      bVar4 = (pMyDisasm->Reserved_).EVEX.state == '\x01';
      IVar3 = 0x110000;
      if (bVar4) {
        IVar3 = 0x140000;
      }
      (pMyDisasm->Instruction).Category = IVar3;
      (pMyDisasm->Reserved_).VSIB_ = 4;
      (pMyDisasm->Reserved_).Register_ = 4;
      (pMyDisasm->Reserved_).MemDecoration = 0x67;
    }
    if (bVar4) {
LAB_00132e58:
      GxEx(pMyDisasm);
      return;
    }
  }
  else {
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vgatherdpd",0xb);
    (pMyDisasm->Reserved_).EVEX.masking = '\x01';
    (pMyDisasm->Reserved_).MemDecoration = 0x67;
    UVar2 = (pMyDisasm->Reserved_).VEX.L;
    if (UVar2 != '\x01') {
      if (UVar2 == '\0') {
        IVar3 = 0x110000;
        if (UVar1 == '\x01') {
          IVar3 = 0x140000;
        }
        (pMyDisasm->Instruction).Category = IVar3;
        (pMyDisasm->Reserved_).VSIB_ = 4;
        (pMyDisasm->Reserved_).Register_ = 4;
        if (UVar1 != '\x01') goto LAB_00132e04;
      }
      else {
        if ((pMyDisasm->Reserved_).EVEX.LL != '\x02') {
          return;
        }
        (pMyDisasm->Instruction).Category = 0x140000;
        (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
        (pMyDisasm->Reserved_).VSIB_ = 0x10;
        (pMyDisasm->Reserved_).Register_ = 0x10;
        (pMyDisasm->Reserved_).MemDecoration = 0x67;
      }
LAB_00132d99:
      decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
      (pMyDisasm->Reserved_).EIP_ =
           (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
      return;
    }
    (pMyDisasm->Instruction).Category = (uint)(UVar1 == '\x01') * 0x20000 + 0x120000;
    (pMyDisasm->Reserved_).VSIB_ = 8;
    (pMyDisasm->Reserved_).Register_ = 8;
    (pMyDisasm->Reserved_).MemDecoration = 0x67;
    if (UVar1 == '\x01') goto LAB_00132d99;
  }
LAB_00132e04:
  GxExVEX(pMyDisasm);
  (pMyDisasm->Operand1).AccessMode = 3;
  (pMyDisasm->Operand3).AccessMode = 3;
  return;
}

Assistant:

void __bea_callspec__ vgatherps_(PDISASM pMyDisasm)
{
 /* ========== 0x66 */
 if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
   GV.OperandSize = GV.OriginalOperandSize;
   pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
   if (GV.VEX.state == InUsePrefix) {
     if (
         ((GV.REX.W_ == 0x0) && (GV.EVEX.state != InUsePrefix)) ||
         ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.W == 0))
       ) {
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vgatherdps");
       #endif
       GV.EVEX.masking = MERGING;
       if (GV.VEX.L == 0) {
         pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
         GV.VSIB_ = SSE_REG;
         GV.Register_ = SSE_REG;
         if (GV.EVEX.state != InUsePrefix) {
           GV.MemDecoration = Arg2dword;
           GxExVEX(pMyDisasm);
           pMyDisasm->Operand1.AccessMode = READ + WRITE;
           pMyDisasm->Operand3.AccessMode = READ + WRITE;
         }
         else {
           GV.MemDecoration = Arg2dword;
           GxEx(pMyDisasm);
         }
       }
       else if (GV.VEX.L == 0x1) {
         pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX2_INSTRUCTION;
         GV.VSIB_ = AVX_REG;

         if (GV.EVEX.state != InUsePrefix) {
           GV.Register_ = SSE_REG;
           GV.MemDecoration = Arg2dword;
           GxExVEX(pMyDisasm);
           pMyDisasm->Operand1.AccessMode = READ + WRITE;
           pMyDisasm->Operand3.AccessMode = READ + WRITE;
         }
         else {
           GV.Register_ = SSE_REG;
           GV.MemDecoration = Arg2dword;
           GxEx(pMyDisasm);
         }
       }
       else if (GV.EVEX.LL == 0x2) {
         GV.EVEX.tupletype = TUPLE1_SCALAR;
         pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
         GV.VSIB_ = AVX512_REG;
         GV.Register_ = AVX_REG;
         GV.MemDecoration = Arg2dword;
         GxEx(pMyDisasm);
       }
     } else {
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vgatherdpd");
       #endif
       GV.EVEX.masking = MERGING;
       GV.MemDecoration = Arg2dword;
       if (GV.VEX.L == 0) {
         pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
         GV.VSIB_ = SSE_REG;
         GV.Register_ = SSE_REG;
         if (GV.EVEX.state != InUsePrefix) {
           GxExVEX(pMyDisasm);
           pMyDisasm->Operand1.AccessMode = READ + WRITE;
           pMyDisasm->Operand3.AccessMode = READ + WRITE;
         }
         else {
           GxEx(pMyDisasm);
         }
       }
       else if (GV.VEX.L == 0x1) {
         pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX2_INSTRUCTION;
         GV.VSIB_ = AVX_REG;
         GV.Register_ = AVX_REG;
         if (GV.EVEX.state != InUsePrefix) {
           GV.MemDecoration = Arg2dword;
           GxExVEX(pMyDisasm);
           pMyDisasm->Operand1.AccessMode = READ + WRITE;
           pMyDisasm->Operand3.AccessMode = READ + WRITE;
         }
         else {
           GV.MemDecoration = Arg2dword;
           GxEx(pMyDisasm);
         }
       }
       else if (GV.EVEX.LL == 0x2) {
         pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
         GV.EVEX.tupletype = TUPLE1_SCALAR;
         GV.VSIB_ = AVX512_REG;
         GV.Register_ = AVX512_REG;
         GV.MemDecoration = Arg2dword;
         GxEx(pMyDisasm);

       }
     }
   } else {
     failDecode(pMyDisasm);
   }
 }
 else {
   failDecode(pMyDisasm);
 }
}